

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  PrimRefMB *pPVar1;
  float fVar2;
  BBox1f BVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  size_t sVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [64];
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  undefined1 in_register_000014c4 [12];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  anon_class_16_2_3fe48c61 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  auVar22._8_56_ = in_register_00001208;
  auVar22._0_8_ = time_range;
  local_a8 = auVar22._0_16_;
  local_b8 = vmovshdup_avx(local_a8);
  auVar42 = ZEXT1664(local_b8);
  fVar2 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar23 = (set->super_PrimInfoMB).max_time_range.upper - fVar2;
  fVar17 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar34 = (((time_range.lower * 0.5 + local_b8._0_4_ * 0.5) - fVar2) / fVar23) * fVar17;
  auVar19._8_4_ = 0x80000000;
  auVar19._0_8_ = 0x8000000080000000;
  auVar19._12_4_ = 0x80000000;
  auVar19 = vandps_avx(ZEXT416((uint)fVar34),auVar19);
  auVar24._8_4_ = 0x3effffff;
  auVar24._0_8_ = 0x3effffff3effffff;
  auVar24._12_4_ = 0x3effffff;
  auVar19 = vorps_avx(auVar19,auVar24);
  auVar19 = ZEXT416((uint)(fVar34 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  fVar2 = (auVar19._0_4_ / fVar17) * fVar23 + fVar2;
  if ((time_range.lower < fVar2) && (fVar2 < local_b8._0_4_)) {
    for (; begin < end; begin = begin + 1) {
      pPVar1 = prims + begin;
      fVar34 = prims[begin].time_range.upper;
      fVar23 = fVar34 * 0.9999;
      if ((auVar22._0_4_ < fVar23) && (fVar17 = (pPVar1->time_range).lower, fVar17 * 1.0001 < fVar2)
         ) {
        auVar28._0_4_ = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        auVar28._4_12_ = in_register_000014c4;
        fVar30 = (auVar22._0_4_ - fVar17) / (fVar34 - fVar17);
        fVar17 = (fVar2 - fVar17) / (fVar34 - fVar17);
        fVar34 = fVar30 * auVar28._0_4_;
        fVar23 = fVar17 * auVar28._0_4_;
        auVar31 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
        auVar35 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),10);
        auVar19 = vmaxss_avx(auVar31,ZEXT816(0));
        auVar24 = vminss_avx(auVar35,auVar28);
        iVar14 = (int)auVar19._0_4_;
        fVar27 = auVar24._0_4_;
        iVar15 = (int)auVar31._0_4_;
        iVar13 = -1;
        if (-1 < iVar15) {
          iVar13 = iVar15;
        }
        iVar9 = (int)auVar28._0_4_ + 1;
        if ((int)auVar35._0_4_ < (int)auVar28._0_4_ + 1) {
          iVar9 = (int)auVar35._0_4_;
        }
        local_d8.this = recalculatePrimRef;
        local_d8.prim = pPVar1;
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&blower0,&local_d8,(long)iVar14);
        SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                  (&bupper1,&local_d8,(long)(int)fVar27);
        fVar34 = fVar34 - auVar19._0_4_;
        if (iVar9 - iVar13 == 1) {
          auVar19 = ZEXT816(0) << 0x40;
          auVar24 = vmaxss_avx(ZEXT416((uint)fVar34),auVar19);
          auVar31 = vshufps_avx(auVar24,auVar24,0);
          auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
          auVar24 = vshufps_avx(auVar24,auVar24,0);
          auVar40._0_4_ =
               auVar31._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar24._0_4_ * blower0.lower.field_0.m128[0];
          auVar40._4_4_ =
               auVar31._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar24._4_4_ * blower0.lower.field_0.m128[1];
          auVar40._8_4_ =
               auVar31._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar24._8_4_ * blower0.lower.field_0.m128[2];
          auVar40._12_4_ =
               auVar31._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar24._12_4_ * blower0.lower.field_0.m128[3];
          auVar46._0_4_ =
               auVar31._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar24._0_4_ * blower0.upper.field_0.m128[0];
          auVar46._4_4_ =
               auVar31._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar24._4_4_ * blower0.upper.field_0.m128[1];
          auVar46._8_4_ =
               auVar31._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar24._8_4_ * blower0.upper.field_0.m128[2];
          auVar46._12_4_ =
               auVar31._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar24._12_4_ * blower0.upper.field_0.m128[3];
          auVar24 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar23)),auVar19);
          auVar28 = vshufps_avx(auVar24,auVar24,0);
          auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
          auVar24 = vshufps_avx(auVar24,auVar24,0);
          auVar31._0_4_ =
               auVar24._0_4_ * bupper1.lower.field_0.m128[0] +
               auVar28._0_4_ * blower0.lower.field_0.m128[0];
          auVar31._4_4_ =
               auVar24._4_4_ * bupper1.lower.field_0.m128[1] +
               auVar28._4_4_ * blower0.lower.field_0.m128[1];
          auVar31._8_4_ =
               auVar24._8_4_ * bupper1.lower.field_0.m128[2] +
               auVar28._8_4_ * blower0.lower.field_0.m128[2];
          auVar31._12_4_ =
               auVar24._12_4_ * bupper1.lower.field_0.m128[3] +
               auVar28._12_4_ * blower0.lower.field_0.m128[3];
          auVar35._0_4_ =
               auVar24._0_4_ * bupper1.upper.field_0.m128[0] +
               auVar28._0_4_ * blower0.upper.field_0.m128[0];
          auVar35._4_4_ =
               auVar24._4_4_ * bupper1.upper.field_0.m128[1] +
               auVar28._4_4_ * blower0.upper.field_0.m128[1];
          auVar35._8_4_ =
               auVar24._8_4_ * bupper1.upper.field_0.m128[2] +
               auVar28._8_4_ * blower0.upper.field_0.m128[2];
          auVar35._12_4_ =
               auVar24._12_4_ * bupper1.upper.field_0.m128[3] +
               auVar28._12_4_ * blower0.upper.field_0.m128[3];
        }
        else {
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&blower1,&local_d8,(long)(iVar14 + 1));
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&bupper0,&local_d8,(long)((int)fVar27 + -1));
          auVar19 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar40._0_4_ =
               auVar24._0_4_ * blower1.lower.field_0.m128[0] +
               auVar19._0_4_ * blower0.lower.field_0.m128[0];
          auVar40._4_4_ =
               auVar24._4_4_ * blower1.lower.field_0.m128[1] +
               auVar19._4_4_ * blower0.lower.field_0.m128[1];
          auVar40._8_4_ =
               auVar24._8_4_ * blower1.lower.field_0.m128[2] +
               auVar19._8_4_ * blower0.lower.field_0.m128[2];
          auVar40._12_4_ =
               auVar24._12_4_ * blower1.lower.field_0.m128[3] +
               auVar19._12_4_ * blower0.lower.field_0.m128[3];
          auVar46._0_4_ =
               auVar24._0_4_ * blower1.upper.field_0.m128[0] +
               auVar19._0_4_ * blower0.upper.field_0.m128[0];
          auVar46._4_4_ =
               auVar24._4_4_ * blower1.upper.field_0.m128[1] +
               auVar19._4_4_ * blower0.upper.field_0.m128[1];
          auVar46._8_4_ =
               auVar24._8_4_ * blower1.upper.field_0.m128[2] +
               auVar19._8_4_ * blower0.upper.field_0.m128[2];
          auVar46._12_4_ =
               auVar24._12_4_ * blower1.upper.field_0.m128[3] +
               auVar19._12_4_ * blower0.upper.field_0.m128[3];
          auVar19 = vmaxss_avx(ZEXT416((uint)(fVar27 - fVar23)),ZEXT816(0) << 0x40);
          auVar24 = vshufps_avx(auVar19,auVar19,0);
          auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
          auVar19 = vshufps_avx(auVar19,auVar19,0);
          auVar31._0_4_ =
               auVar24._0_4_ * bupper0.lower.field_0.m128[0] +
               auVar19._0_4_ * bupper1.lower.field_0.m128[0];
          auVar31._4_4_ =
               auVar24._4_4_ * bupper0.lower.field_0.m128[1] +
               auVar19._4_4_ * bupper1.lower.field_0.m128[1];
          auVar31._8_4_ =
               auVar24._8_4_ * bupper0.lower.field_0.m128[2] +
               auVar19._8_4_ * bupper1.lower.field_0.m128[2];
          auVar31._12_4_ =
               auVar24._12_4_ * bupper0.lower.field_0.m128[3] +
               auVar19._12_4_ * bupper1.lower.field_0.m128[3];
          auVar35._0_4_ =
               auVar24._0_4_ * bupper0.upper.field_0.m128[0] +
               auVar19._0_4_ * bupper1.upper.field_0.m128[0];
          auVar35._4_4_ =
               auVar24._4_4_ * bupper0.upper.field_0.m128[1] +
               auVar19._4_4_ * bupper1.upper.field_0.m128[1];
          auVar35._8_4_ =
               auVar24._8_4_ * bupper0.upper.field_0.m128[2] +
               auVar19._8_4_ * bupper1.upper.field_0.m128[2];
          auVar35._12_4_ =
               auVar24._12_4_ * bupper0.upper.field_0.m128[3] +
               auVar19._12_4_ * bupper1.upper.field_0.m128[3];
          if (iVar15 < 0) {
            iVar15 = -1;
          }
          sVar16 = (size_t)iVar15;
          while (sVar16 = sVar16 + 1, (long)sVar16 < (long)iVar9) {
            auVar18._0_4_ = ((float)(int)sVar16 / auVar28._0_4_ - fVar30) / (fVar17 - fVar30);
            auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar19 = vshufps_avx(auVar18,auVar18,0);
            fVar34 = auVar31._4_4_;
            fVar23 = auVar31._8_4_;
            fVar27 = auVar31._12_4_;
            auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar18._0_4_)),
                                  ZEXT416((uint)(1.0 - auVar18._0_4_)),0);
            fVar43 = auVar40._4_4_;
            fVar44 = auVar40._8_4_;
            fVar45 = auVar40._12_4_;
            fVar37 = auVar35._4_4_;
            fVar38 = auVar35._8_4_;
            fVar39 = auVar35._12_4_;
            fVar48 = auVar46._4_4_;
            fVar49 = auVar46._8_4_;
            fVar50 = auVar46._12_4_;
            local_c8 = auVar35._0_4_ * auVar19._0_4_ + auVar46._0_4_ * auVar24._0_4_;
            fStack_c4 = fVar37 * auVar19._4_4_ + fVar48 * auVar24._4_4_;
            fStack_c0 = fVar38 * auVar19._8_4_ + fVar49 * auVar24._8_4_;
            fStack_bc = fVar39 * auVar19._12_4_ + fVar50 * auVar24._12_4_;
            SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                      (&bi,&local_d8,sVar16);
            auVar8._4_4_ = fVar34 * auVar19._4_4_ + fVar43 * auVar24._4_4_;
            auVar8._0_4_ = auVar31._0_4_ * auVar19._0_4_ + auVar40._0_4_ * auVar24._0_4_;
            auVar8._8_4_ = fVar23 * auVar19._8_4_ + fVar44 * auVar24._8_4_;
            auVar8._12_4_ = fVar27 * auVar19._12_4_ + fVar45 * auVar24._12_4_;
            auVar19 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar8);
            auVar11._4_4_ = fStack_c4;
            auVar11._0_4_ = local_c8;
            auVar11._8_4_ = fStack_c0;
            auVar11._12_4_ = fStack_bc;
            auVar8 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar11);
            auVar24 = vminps_avx(auVar19,ZEXT816(0) << 0x40);
            auVar19 = vmaxps_avx(auVar8,ZEXT816(0) << 0x40);
            auVar40._0_4_ = auVar40._0_4_ + auVar24._0_4_;
            auVar40._4_4_ = fVar43 + auVar24._4_4_;
            auVar40._8_4_ = fVar44 + auVar24._8_4_;
            auVar40._12_4_ = fVar45 + auVar24._12_4_;
            auVar31._0_4_ = auVar31._0_4_ + auVar24._0_4_;
            auVar31._4_4_ = fVar34 + auVar24._4_4_;
            auVar31._8_4_ = fVar23 + auVar24._8_4_;
            auVar31._12_4_ = fVar27 + auVar24._12_4_;
            auVar46._0_4_ = auVar46._0_4_ + auVar19._0_4_;
            auVar46._4_4_ = fVar48 + auVar19._4_4_;
            auVar46._8_4_ = fVar49 + auVar19._8_4_;
            auVar46._12_4_ = fVar50 + auVar19._12_4_;
            auVar35._0_4_ = auVar35._0_4_ + auVar19._0_4_;
            auVar35._4_4_ = fVar37 + auVar19._4_4_;
            auVar35._8_4_ = fVar38 + auVar19._8_4_;
            auVar35._12_4_ = fVar39 + auVar19._12_4_;
          }
          auVar19 = ZEXT816(0) << 0x40;
        }
        aVar6.m128 = (__m128)vminps_avx(this->bounds0[0].bounds0.lower.field_0,auVar40);
        aVar4.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds0.upper.field_0,auVar46);
        aVar7.m128 = (__m128)vminps_avx(this->bounds0[0].bounds1.lower.field_0,auVar31);
        aVar5.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds1.upper.field_0,auVar35);
        this->bounds0[0].bounds0.lower.field_0 = aVar6;
        this->bounds0[0].bounds0.upper.field_0 = aVar4;
        this->bounds0[0].bounds1.lower.field_0 = aVar7;
        this->bounds0[0].bounds1.upper.field_0 = aVar5;
        auVar32._0_4_ = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
        auVar32._4_12_ = in_register_000014c4;
        BVar3 = pPVar1->time_range;
        auVar25._8_8_ = 0;
        auVar25._0_4_ = BVar3.lower;
        auVar25._4_4_ = BVar3.upper;
        auVar24 = vmovshdup_avx(auVar25);
        fVar23 = BVar3.lower;
        fVar34 = auVar24._0_4_ - fVar23;
        auVar22 = ZEXT1664(local_a8);
        auVar24 = ZEXT416((uint)(((local_a8._0_4_ - fVar23) / fVar34) * 1.0000002 * auVar32._0_4_));
        auVar24 = vroundss_avx(auVar24,auVar24,9);
        auVar19 = vmaxss_avx(auVar19,auVar24);
        auVar24 = ZEXT416((uint)(((fVar2 - fVar23) / fVar34) * 0.99999976 * auVar32._0_4_));
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar24 = vminss_avx(auVar24,auVar32);
        this->count0[0] = this->count0[0] + (long)((int)auVar24._0_4_ - (int)auVar19._0_4_);
        fVar34 = (pPVar1->time_range).upper;
        fVar23 = fVar34 * 0.9999;
        auVar42 = ZEXT1664(local_b8);
      }
      if (fVar2 < fVar23) {
        fVar23 = (pPVar1->time_range).lower;
        if (fVar23 * 1.0001 < auVar42._0_4_) {
          auVar29._0_4_ = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
          auVar29._4_12_ = in_register_000014c4;
          fVar27 = (fVar2 - fVar23) / (fVar34 - fVar23);
          fVar17 = (auVar42._0_4_ - fVar23) / (fVar34 - fVar23);
          fVar34 = fVar27 * auVar29._0_4_;
          fVar23 = fVar17 * auVar29._0_4_;
          auVar31 = vroundss_avx(ZEXT416((uint)fVar34),ZEXT416((uint)fVar34),9);
          auVar35 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),10);
          auVar19 = vmaxss_avx(auVar31,ZEXT816(0));
          auVar24 = vminss_avx(auVar35,auVar29);
          iVar14 = (int)auVar19._0_4_;
          fVar30 = auVar24._0_4_;
          iVar15 = (int)auVar31._0_4_;
          iVar13 = -1;
          if (-1 < iVar15) {
            iVar13 = iVar15;
          }
          iVar9 = (int)auVar29._0_4_ + 1;
          if ((int)auVar35._0_4_ < (int)auVar29._0_4_ + 1) {
            iVar9 = (int)auVar35._0_4_;
          }
          local_d8.this = recalculatePrimRef;
          local_d8.prim = pPVar1;
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&blower0,&local_d8,(long)iVar14);
          SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                    (&bupper1,&local_d8,(long)(int)fVar30);
          fVar34 = fVar34 - auVar19._0_4_;
          if (iVar9 - iVar13 == 1) {
            auVar19 = ZEXT816(0) << 0x40;
            auVar24 = vmaxss_avx(ZEXT416((uint)fVar34),auVar19);
            auVar31 = vshufps_avx(auVar24,auVar24,0);
            auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
            auVar24 = vshufps_avx(auVar24,auVar24,0);
            auVar41._0_4_ =
                 auVar31._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar24._0_4_ * blower0.lower.field_0.m128[0];
            auVar41._4_4_ =
                 auVar31._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar24._4_4_ * blower0.lower.field_0.m128[1];
            auVar41._8_4_ =
                 auVar31._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar24._8_4_ * blower0.lower.field_0.m128[2];
            auVar41._12_4_ =
                 auVar31._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar24._12_4_ * blower0.lower.field_0.m128[3];
            auVar47._0_4_ =
                 auVar31._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar24._0_4_ * blower0.upper.field_0.m128[0];
            auVar47._4_4_ =
                 auVar31._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar24._4_4_ * blower0.upper.field_0.m128[1];
            auVar47._8_4_ =
                 auVar31._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar24._8_4_ * blower0.upper.field_0.m128[2];
            auVar47._12_4_ =
                 auVar31._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar24._12_4_ * blower0.upper.field_0.m128[3];
            auVar24 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar23)),auVar19);
            auVar31 = vshufps_avx(auVar24,auVar24,0);
            auVar24 = ZEXT416((uint)(1.0 - auVar24._0_4_));
            auVar24 = vshufps_avx(auVar24,auVar24,0);
            auVar33._0_4_ =
                 auVar24._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar31._0_4_ * blower0.lower.field_0.m128[0];
            auVar33._4_4_ =
                 auVar24._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar31._4_4_ * blower0.lower.field_0.m128[1];
            auVar33._8_4_ =
                 auVar24._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar31._8_4_ * blower0.lower.field_0.m128[2];
            auVar33._12_4_ =
                 auVar24._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar31._12_4_ * blower0.lower.field_0.m128[3];
            auVar36._0_4_ =
                 auVar24._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar31._0_4_ * blower0.upper.field_0.m128[0];
            auVar36._4_4_ =
                 auVar24._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar31._4_4_ * blower0.upper.field_0.m128[1];
            auVar36._8_4_ =
                 auVar24._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar31._8_4_ * blower0.upper.field_0.m128[2];
            auVar36._12_4_ =
                 auVar24._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar31._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                      (&blower1,&local_d8,(long)(iVar14 + 1));
            SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                      (&bupper0,&local_d8,(long)((int)fVar30 + -1));
            auVar19 = vmaxss_avx(ZEXT416((uint)fVar34),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar19,auVar19,0);
            auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
            auVar19 = vshufps_avx(auVar19,auVar19,0);
            auVar41._0_4_ =
                 auVar24._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar19._0_4_ * blower0.lower.field_0.m128[0];
            auVar41._4_4_ =
                 auVar24._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar19._4_4_ * blower0.lower.field_0.m128[1];
            auVar41._8_4_ =
                 auVar24._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar19._8_4_ * blower0.lower.field_0.m128[2];
            auVar41._12_4_ =
                 auVar24._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar19._12_4_ * blower0.lower.field_0.m128[3];
            auVar47._0_4_ =
                 auVar24._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar19._0_4_ * blower0.upper.field_0.m128[0];
            auVar47._4_4_ =
                 auVar24._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar19._4_4_ * blower0.upper.field_0.m128[1];
            auVar47._8_4_ =
                 auVar24._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar19._8_4_ * blower0.upper.field_0.m128[2];
            auVar47._12_4_ =
                 auVar24._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar19._12_4_ * blower0.upper.field_0.m128[3];
            auVar19 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar23)),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar19,auVar19,0);
            auVar19 = ZEXT416((uint)(1.0 - auVar19._0_4_));
            auVar19 = vshufps_avx(auVar19,auVar19,0);
            auVar33._0_4_ =
                 auVar24._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar19._0_4_ * bupper1.lower.field_0.m128[0];
            auVar33._4_4_ =
                 auVar24._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar19._4_4_ * bupper1.lower.field_0.m128[1];
            auVar33._8_4_ =
                 auVar24._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar19._8_4_ * bupper1.lower.field_0.m128[2];
            auVar33._12_4_ =
                 auVar24._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar19._12_4_ * bupper1.lower.field_0.m128[3];
            auVar36._0_4_ =
                 auVar24._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar19._0_4_ * bupper1.upper.field_0.m128[0];
            auVar36._4_4_ =
                 auVar24._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar19._4_4_ * bupper1.upper.field_0.m128[1];
            auVar36._8_4_ =
                 auVar24._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar19._8_4_ * bupper1.upper.field_0.m128[2];
            auVar36._12_4_ =
                 auVar24._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar19._12_4_ * bupper1.upper.field_0.m128[3];
            if (iVar15 < 0) {
              iVar15 = -1;
            }
            sVar16 = (size_t)iVar15;
            while (sVar16 = sVar16 + 1, (long)sVar16 < (long)iVar9) {
              auVar20._0_4_ = ((float)(int)sVar16 / auVar29._0_4_ - fVar27) / (fVar17 - fVar27);
              auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar19 = vshufps_avx(auVar20,auVar20,0);
              fVar34 = auVar33._4_4_;
              fVar23 = auVar33._8_4_;
              fVar30 = auVar33._12_4_;
              auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar20._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar20._0_4_)),0);
              fVar43 = auVar41._4_4_;
              fVar44 = auVar41._8_4_;
              fVar45 = auVar41._12_4_;
              fVar37 = auVar36._4_4_;
              fVar38 = auVar36._8_4_;
              fVar39 = auVar36._12_4_;
              fVar48 = auVar47._4_4_;
              fVar49 = auVar47._8_4_;
              fVar50 = auVar47._12_4_;
              local_c8 = auVar36._0_4_ * auVar19._0_4_ + auVar47._0_4_ * auVar24._0_4_;
              fStack_c4 = fVar37 * auVar19._4_4_ + fVar48 * auVar24._4_4_;
              fStack_c0 = fVar38 * auVar19._8_4_ + fVar49 * auVar24._8_4_;
              fStack_bc = fVar39 * auVar19._12_4_ + fVar50 * auVar24._12_4_;
              SubdivRecalculatePrimRef::linearBounds::anon_class_16_2_3fe48c61::operator()
                        (&bi,&local_d8,sVar16);
              auVar10._4_4_ = fVar34 * auVar19._4_4_ + fVar43 * auVar24._4_4_;
              auVar10._0_4_ = auVar33._0_4_ * auVar19._0_4_ + auVar41._0_4_ * auVar24._0_4_;
              auVar10._8_4_ = fVar23 * auVar19._8_4_ + fVar44 * auVar24._8_4_;
              auVar10._12_4_ = fVar30 * auVar19._12_4_ + fVar45 * auVar24._12_4_;
              auVar19 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar10);
              auVar12._4_4_ = fStack_c4;
              auVar12._0_4_ = local_c8;
              auVar12._8_4_ = fStack_c0;
              auVar12._12_4_ = fStack_bc;
              auVar31 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar12);
              auVar24 = vminps_avx(auVar19,ZEXT816(0) << 0x40);
              auVar19 = vmaxps_avx(auVar31,ZEXT816(0) << 0x40);
              auVar41._0_4_ = auVar41._0_4_ + auVar24._0_4_;
              auVar41._4_4_ = fVar43 + auVar24._4_4_;
              auVar41._8_4_ = fVar44 + auVar24._8_4_;
              auVar41._12_4_ = fVar45 + auVar24._12_4_;
              auVar33._0_4_ = auVar33._0_4_ + auVar24._0_4_;
              auVar33._4_4_ = fVar34 + auVar24._4_4_;
              auVar33._8_4_ = fVar23 + auVar24._8_4_;
              auVar33._12_4_ = fVar30 + auVar24._12_4_;
              auVar47._0_4_ = auVar47._0_4_ + auVar19._0_4_;
              auVar47._4_4_ = fVar48 + auVar19._4_4_;
              auVar47._8_4_ = fVar49 + auVar19._8_4_;
              auVar47._12_4_ = fVar50 + auVar19._12_4_;
              auVar36._0_4_ = auVar36._0_4_ + auVar19._0_4_;
              auVar36._4_4_ = fVar37 + auVar19._4_4_;
              auVar36._8_4_ = fVar38 + auVar19._8_4_;
              auVar36._12_4_ = fVar39 + auVar19._12_4_;
            }
            auVar19 = ZEXT816(0) << 0x40;
          }
          aVar6.m128 = (__m128)vminps_avx(this->bounds1[0].bounds0.lower.field_0,auVar41);
          aVar4.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds0.upper.field_0,auVar47);
          aVar7.m128 = (__m128)vminps_avx(this->bounds1[0].bounds1.lower.field_0,auVar33);
          aVar5.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds1.upper.field_0,auVar36);
          this->bounds1[0].bounds0.lower.field_0 = aVar6;
          this->bounds1[0].bounds0.upper.field_0 = aVar4;
          this->bounds1[0].bounds1.lower.field_0 = aVar7;
          this->bounds1[0].bounds1.upper.field_0 = aVar5;
          auVar21._0_4_ = (float)(uint)(pPVar1->lbounds).bounds1.upper.field_0.m128[3];
          auVar21._4_12_ = in_register_000014c4;
          BVar3 = pPVar1->time_range;
          auVar26._8_8_ = 0;
          auVar26._0_4_ = BVar3.lower;
          auVar26._4_4_ = BVar3.upper;
          fVar23 = BVar3.lower;
          auVar24 = vmovshdup_avx(auVar26);
          fVar34 = auVar24._0_4_ - fVar23;
          auVar42 = ZEXT1664(local_b8);
          auVar24 = ZEXT416((uint)(((fVar2 - fVar23) / fVar34) * 1.0000002 * auVar21._0_4_));
          auVar24 = vroundss_avx(auVar24,auVar24,9);
          auVar19 = vmaxss_avx(auVar19,auVar24);
          auVar24 = ZEXT416((uint)(((local_b8._0_4_ - fVar23) / fVar34) * 0.99999976 * auVar21._0_4_
                                  ));
          auVar24 = vroundss_avx(auVar24,auVar24,10);
          auVar24 = vminss_avx(auVar24,auVar21);
          this->count1[0] = this->count1[0] + (long)((int)auVar24._0_4_ - (int)auVar19._0_4_);
          auVar22 = ZEXT1664(local_a8);
        }
      }
    }
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }